

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_Concatenation_Test::testBody(TEST_SimpleString_Concatenation_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *pcVar4;
  char *pcVar5;
  SimpleString local_b0;
  SimpleString local_a0;
  undefined1 local_90 [8];
  SimpleString s5;
  SimpleString local_70;
  undefined1 local_60 [8];
  SimpleString s4;
  SimpleString s3;
  undefined1 local_30 [8];
  SimpleString s2;
  SimpleString s1;
  TEST_SimpleString_Concatenation_Test *this_local;
  
  SimpleString::SimpleString((SimpleString *)&s2.bufferSize_,"hello!");
  SimpleString::SimpleString((SimpleString *)local_30,"goodbye!");
  SimpleString::SimpleString((SimpleString *)&s4.bufferSize_,"hello!goodbye!");
  SimpleString::SimpleString((SimpleString *)local_60,"");
  SimpleString::operator+=((SimpleString *)local_60,(SimpleString *)&s2.bufferSize_);
  SimpleString::operator+=((SimpleString *)local_60,(SimpleString *)local_30);
  bVar1 = operator!=((SimpleString *)&s4.bufferSize_,(SimpleString *)local_60);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)local_60,(SimpleString *)local_60);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x145);
    }
    bVar1 = operator!=((SimpleString *)&s4.bufferSize_,(SimpleString *)&s4.bufferSize_);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x145);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&local_70);
    pcVar4 = SimpleString::asCharString(&local_70);
    StringFrom((SimpleString *)&s5.bufferSize_);
    pcVar5 = SimpleString::asCharString((SimpleString *)&s5.bufferSize_);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x145,pTVar3);
    SimpleString::~SimpleString((SimpleString *)&s5.bufferSize_);
    SimpleString::~SimpleString(&local_70);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x145,pTVar3);
  }
  SimpleString::SimpleString((SimpleString *)local_90,"hello!goodbye!hello!goodbye!");
  SimpleString::operator+=((SimpleString *)local_60,(SimpleString *)local_60);
  bVar1 = operator!=((SimpleString *)local_90,(SimpleString *)local_60);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)local_60,(SimpleString *)local_60);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x14a);
    }
    bVar1 = operator!=((SimpleString *)local_90,(SimpleString *)local_90);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x14a);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&local_a0);
    pcVar4 = SimpleString::asCharString(&local_a0);
    StringFrom(&local_b0);
    pcVar5 = SimpleString::asCharString(&local_b0);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x14a,pTVar3);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_a0);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x14a,pTVar3);
  }
  SimpleString::~SimpleString((SimpleString *)local_90);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)&s4.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&s2.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, Concatenation)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 += s1;
    s4 += s2;

    CHECK_EQUAL(s3, s4);

    SimpleString s5("hello!goodbye!hello!goodbye!");
    s4 += s4;

    CHECK_EQUAL(s5, s4);
}